

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::DecimalCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  NotImplementedException *this;
  InternalException *this_00;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var3;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_f0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_e8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_e0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_d8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_d0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_c8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_c0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_b8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_b0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_a8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_a0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_98;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_90;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_88;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_80;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_78;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_70;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_68;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_60;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_58;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_50;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_48;
  string local_40;
  
  LVar1 = target->id_;
  switch(LVar1) {
  case BOOLEAN:
    local_48._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<bool>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_48,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_48._M_head_impl;
    break;
  case TINYINT:
    local_50._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<signed_char>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_50,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_50._M_head_impl;
    break;
  case SMALLINT:
    local_58._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<short>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_58,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_58._M_head_impl;
    break;
  case INTEGER:
    local_60._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<int>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_60,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_60._M_head_impl;
    break;
  case BIGINT:
    local_68._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<long>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_68,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_68._M_head_impl;
    break;
  case DECIMAL:
    PVar2 = source->physical_type_;
    if (PVar2 < INT64) {
      if (PVar2 == INT16) {
        local_a0._M_head_impl = (BoundCastData *)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,DecimalDecimalCastSwitch<short,duckdb::NumericHelper>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_a0,(init_cast_local_state_t)0x0);
        _Var3._M_head_impl = local_a0._M_head_impl;
      }
      else {
        if (PVar2 != INT32) {
LAB_007dbad5:
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "Unimplemented internal type for decimal in decimal_decimal cast","");
          NotImplementedException::NotImplementedException(this,&local_40);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_a8._M_head_impl = (BoundCastData *)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,DecimalDecimalCastSwitch<int,duckdb::NumericHelper>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_a8,(init_cast_local_state_t)0x0);
        _Var3._M_head_impl = local_a8._M_head_impl;
      }
    }
    else if (PVar2 == INT64) {
      local_b0._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,DecimalDecimalCastSwitch<long,duckdb::NumericHelper>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_b0,(init_cast_local_state_t)0x0);
      _Var3._M_head_impl = local_b0._M_head_impl;
    }
    else {
      if (PVar2 != INT128) goto LAB_007dbad5;
      local_b8._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,DecimalDecimalCastSwitch<duckdb::hugeint_t,duckdb::Hugeint>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_b8,(init_cast_local_state_t)0x0);
      _Var3._M_head_impl = local_b8._M_head_impl;
    }
    break;
  case FLOAT:
    local_c0._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<float>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_c0,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_c0._M_head_impl;
    break;
  case DOUBLE:
    local_c8._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<double>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_c8,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_c8._M_head_impl;
    break;
  case VARCHAR:
    PVar2 = source->physical_type_;
    if (PVar2 < INT64) {
      if (PVar2 == INT16) {
        local_d0._M_head_impl = (BoundCastData *)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,DecimalToStringCast<short>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_d0,(init_cast_local_state_t)0x0);
        _Var3._M_head_impl = local_d0._M_head_impl;
      }
      else {
        if (PVar2 != INT32) {
LAB_007dbb36:
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Unimplemented internal decimal type","");
          InternalException::InternalException(this_00,&local_40);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_d8._M_head_impl = (BoundCastData *)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,DecimalToStringCast<int>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_d8,(init_cast_local_state_t)0x0);
        _Var3._M_head_impl = local_d8._M_head_impl;
      }
    }
    else if (PVar2 == INT64) {
      local_e0._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,DecimalToStringCast<long>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_e0,(init_cast_local_state_t)0x0);
      _Var3._M_head_impl = local_e0._M_head_impl;
    }
    else {
      if (PVar2 != INT128) goto LAB_007dbb36;
      local_e8._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,DecimalToStringCast<duckdb::hugeint_t>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_e8,(init_cast_local_state_t)0x0);
      _Var3._M_head_impl = local_e8._M_head_impl;
    }
    break;
  case UTINYINT:
    local_70._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<unsigned_char>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_70,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_70._M_head_impl;
    break;
  case USMALLINT:
    local_78._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<unsigned_short>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_78,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_78._M_head_impl;
    break;
  case UINTEGER:
    local_80._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<unsigned_int>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_80,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_80._M_head_impl;
    break;
  case UBIGINT:
    local_88._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,FromDecimalCast<unsigned_long>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_88,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_88._M_head_impl;
    break;
  default:
    if (LVar1 == UHUGEINT) {
      local_98._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,FromDecimalCast<duckdb::uhugeint_t>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_98,(init_cast_local_state_t)0x0);
      _Var3._M_head_impl = local_98._M_head_impl;
      break;
    }
    if (LVar1 == HUGEINT) {
      local_90._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,FromDecimalCast<duckdb::hugeint_t>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_90,(init_cast_local_state_t)0x0);
      _Var3._M_head_impl = local_90._M_head_impl;
      break;
    }
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case CHAR:
  case BLOB:
  case INTERVAL:
    local_f0._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_f0,(init_cast_local_state_t)0x0);
    _Var3._M_head_impl = local_f0._M_head_impl;
  }
  if (_Var3._M_head_impl != (BoundCastData *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::DecimalCastSwitch(BindCastInput &input, const LogicalType &source,
                                              const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::BOOLEAN:
		return FromDecimalCast<bool>;
	case LogicalTypeId::TINYINT:
		return FromDecimalCast<int8_t>;
	case LogicalTypeId::SMALLINT:
		return FromDecimalCast<int16_t>;
	case LogicalTypeId::INTEGER:
		return FromDecimalCast<int32_t>;
	case LogicalTypeId::BIGINT:
		return FromDecimalCast<int64_t>;
	case LogicalTypeId::UTINYINT:
		return FromDecimalCast<uint8_t>;
	case LogicalTypeId::USMALLINT:
		return FromDecimalCast<uint16_t>;
	case LogicalTypeId::UINTEGER:
		return FromDecimalCast<uint32_t>;
	case LogicalTypeId::UBIGINT:
		return FromDecimalCast<uint64_t>;
	case LogicalTypeId::HUGEINT:
		return FromDecimalCast<hugeint_t>;
	case LogicalTypeId::UHUGEINT:
		return FromDecimalCast<uhugeint_t>;
	case LogicalTypeId::DECIMAL: {
		// decimal to decimal cast
		// first we need to figure out the source and target internal types
		switch (source.InternalType()) {
		case PhysicalType::INT16:
			return DecimalDecimalCastSwitch<int16_t, NumericHelper>;
		case PhysicalType::INT32:
			return DecimalDecimalCastSwitch<int32_t, NumericHelper>;
		case PhysicalType::INT64:
			return DecimalDecimalCastSwitch<int64_t, NumericHelper>;
		case PhysicalType::INT128:
			return DecimalDecimalCastSwitch<hugeint_t, Hugeint>;
		default:
			throw NotImplementedException("Unimplemented internal type for decimal in decimal_decimal cast");
		}
	}
	case LogicalTypeId::FLOAT:
		return FromDecimalCast<float>;
	case LogicalTypeId::DOUBLE:
		return FromDecimalCast<double>;
	case LogicalTypeId::VARCHAR: {
		switch (source.InternalType()) {
		case PhysicalType::INT16:
			return DecimalToStringCast<int16_t>;
		case PhysicalType::INT32:
			return DecimalToStringCast<int32_t>;
		case PhysicalType::INT64:
			return DecimalToStringCast<int64_t>;
		case PhysicalType::INT128:
			return DecimalToStringCast<hugeint_t>;
		default:
			throw InternalException("Unimplemented internal decimal type");
		}
	}
	default:
		return DefaultCasts::TryVectorNullCast;
	}
}